

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsDetachArrayBuffer(JsValueRef arrayBuffer)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  ArrayBuffer *this;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar1 = Js::VarIs<Js::ArrayBuffer>(arrayBuffer);
      JVar2 = JsErrorInvalidArgument;
      if (bVar1) {
        this = Js::VarTo<Js::ArrayBuffer>(arrayBuffer);
        JVar2 = JsNoError;
        Js::ArrayBuffer::Detach(this);
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsDetachArrayBuffer(
    _In_ JsValueRef arrayBuffer)
{
    VALIDATE_JSREF(arrayBuffer);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            return JsErrorInvalidArgument;
        }

        Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->Detach();
        return JsNoError;
    });
}